

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::CheckTargetsForType(cmGlobalGenerator *this)

{
  cmGeneratorTarget *this_00;
  cmake *this_01;
  string *psVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  cmGlobalGenerator *local_68;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Swift","");
  bVar2 = cmState::GetLanguageEnabled
                    ((this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_80 = (this->LocalGenerators).
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_88 = (this->LocalGenerators).
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_80 != local_88) {
      bVar2 = false;
      local_68 = this;
      do {
        local_70 = ((*local_80)->GeneratorTargets).
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_78 = ((*local_80)->GeneratorTargets).
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (local_70 != local_78) {
          do {
            this_00 = *local_70;
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmMakefile::GetConfigurations
                      ((string *)(local_60 + 0x10),this_00->Makefile,&local_a8,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._16_8_ != &local_40) {
              operator_delete((void *)local_60._16_8_,local_40._M_allocated_capacity + 1);
            }
            config = local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar1 = local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (local_a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::emplace_back<>(&local_a8);
              config = local_a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              psVar1 = local_a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            }
            for (; config != psVar1; config = config + 1) {
              cmGeneratorTarget::GetLinkerLanguage(&local_c8,this_00,config);
              iVar4 = std::__cxx11::string::compare((char *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar4 == 0) {
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c8,"WIN32_EXECUTABLE","");
                bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                if (bVar3) {
                  this_01 = local_68->CMakeInstance;
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c8,
                             "WIN32_EXECUTABLE property is not supported on Swift executables","");
                  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_60);
                  cmake::IssueMessage(this_01,FATAL_ERROR,&local_c8,(cmListFileBacktrace *)local_60)
                  ;
                  if ((cmMakefile *)local_60._8_8_ != (cmMakefile *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p,
                                    local_c8.field_2._M_allocated_capacity + 1);
                  }
                  bVar2 = true;
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_a8);
            local_70 = local_70 + 1;
          } while (local_70 != local_78);
        }
        local_80 = local_80 + 1;
      } while (local_80 != local_88);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForType() const
{
  if (!this->GetLanguageEnabled("Swift")) {
    return false;
  }
  bool failed = false;
  for (cmLocalGenerator* generator : this->LocalGenerators) {
    for (cmGeneratorTarget* target : generator->GetGeneratorTargets()) {
      std::vector<std::string> configs;
      target->Makefile->GetConfigurations(configs);
      if (configs.empty()) {
        configs.emplace_back();
      }

      for (std::string const& config : configs) {
        if (target->GetLinkerLanguage(config) == "Swift") {
          if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
            this->GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "WIN32_EXECUTABLE property is not supported on Swift "
              "executables",
              target->GetBacktrace());
            failed = true;
          }
        }
      }
    }
  }
  return failed;
}